

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

TimerId __thiscall
sznet::net::EventLoop::runEvery(EventLoop *this,double interval,TimerCallback *cb)

{
  pointer this_00;
  TimerId TVar1;
  function<void_()> local_60;
  int64_t local_40;
  Timestamp local_38;
  Timestamp time;
  TimerCallback *cb_local;
  double interval_local;
  EventLoop *this_local;
  
  time.m_microSecondsSinceEpoch = (int64_t)cb;
  local_40 = (int64_t)Timestamp::now();
  local_38 = addTime((Timestamp)local_40,interval);
  this_00 = std::unique_ptr<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>::operator->
                      (&this->m_timerQueue);
  std::function<void_()>::function(&local_60,cb);
  TVar1 = TimerQueue::addTimer(this_00,&local_60,local_38,interval);
  std::function<void_()>::~function(&local_60);
  return TVar1;
}

Assistant:

TimerId EventLoop::runEvery(double interval, TimerCallback cb)
{
	Timestamp time(addTime(Timestamp::now(), interval));
	return m_timerQueue->addTimer(std::move(cb), time, interval);
}